

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O3

UBool __thiscall icu_63::MeasureUnit::operator==(MeasureUnit *this,UObject *other)

{
  char *__s1;
  int iVar1;
  
  if (this == (MeasureUnit *)other) {
    return '\x01';
  }
  __s1 = *(char **)((this->super_UObject)._vptr_UObject[-1] + 8);
  if ((((__s1 == *(char **)(other->_vptr_UObject[-1] + 8)) ||
       ((*__s1 != '*' && (iVar1 = strcmp(__s1,*(char **)(other->_vptr_UObject[-1] + 8)), iVar1 == 0)
        ))) && (this->fTypeId == *(int *)&other[1]._vptr_UObject)) &&
     (this->fSubTypeId == *(int *)((long)&other[1]._vptr_UObject + 4))) {
    iVar1 = strcmp(this->fCurrency,(char *)(other + 2));
    return iVar1 == 0;
  }
  return '\0';
}

Assistant:

UBool MeasureUnit::operator==(const UObject& other) const {
    if (this == &other) {  // Same object, equal
        return TRUE;
    }
    if (typeid(*this) != typeid(other)) { // Different types, not equal
        return FALSE;
    }
    const MeasureUnit &rhs = static_cast<const MeasureUnit&>(other);
    return (
            fTypeId == rhs.fTypeId
            && fSubTypeId == rhs.fSubTypeId
            && uprv_strcmp(fCurrency, rhs.fCurrency) == 0);
}